

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

void roaring64_bitmap_or_inplace(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  long in_RSI;
  long in_RDI;
  byte bVar1;
  byte bVar2;
  leaf_t *result_leaf;
  container_t *container2;
  uint8_t typecode2;
  leaf_t *leaf2;
  leaf_t *leaf1;
  int compare_result;
  _Bool it2_present;
  _Bool it1_present;
  art_iterator_t it2;
  art_iterator_t it1;
  undefined7 in_stack_fffffffffffffea8;
  uint8_t type;
  leaf_t *in_stack_fffffffffffffeb0;
  art_iterator_t *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  uint8_t in_stack_fffffffffffffec7;
  uint8_t type1;
  long lVar3;
  int iVar4;
  undefined2 in_stack_fffffffffffffedc;
  container_t *local_118;
  long local_90;
  
  if (in_RDI != in_RSI) {
    art_init_iterator((art_t *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                      SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
    art_init_iterator((art_t *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                      SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
    while (type = local_90 != 0 || local_118 != (container_t *)0x0,
          local_90 != 0 || local_118 != (container_t *)0x0) {
      bVar1 = local_90 != 0;
      bVar2 = local_118 != (container_t *)0x0;
      iVar4 = 0;
      if ((((bool)bVar1) && ((bool)bVar2)) &&
         (iVar4 = compare_high48((art_key_chunk_t *)in_stack_fffffffffffffeb0,
                                 (art_key_chunk_t *)CONCAT17(type,in_stack_fffffffffffffea8)),
         iVar4 == 0)) {
        type1 = (uint8_t)((ulong)local_90 >> 0x38);
        lVar3 = local_90;
        if (*(char *)(local_90 + 6) == '\x04') {
          in_stack_fffffffffffffeb8 =
               (art_iterator_t *)
               container_or((container_t *)
                            ((ulong)CONCAT13(bVar1,CONCAT12(bVar2,in_stack_fffffffffffffedc)) <<
                            0x20),type1,local_118,in_stack_fffffffffffffec7,
                            in_stack_fffffffffffffeb8->key);
        }
        else {
          in_stack_fffffffffffffeb8 =
               (art_iterator_t *)
               container_ior((container_t *)
                             ((ulong)CONCAT13(bVar1,CONCAT12(bVar2,in_stack_fffffffffffffedc)) <<
                             0x20),type1,local_118,in_stack_fffffffffffffec7,
                             in_stack_fffffffffffffeb8->key);
        }
        if (in_stack_fffffffffffffeb8 != *(art_iterator_t **)(lVar3 + 8)) {
          container_free(in_stack_fffffffffffffeb0,type);
          *(art_iterator_t **)(lVar3 + 8) = in_stack_fffffffffffffeb8;
          *(uint8_t *)(lVar3 + 6) = in_stack_fffffffffffffec7;
        }
        art_iterator_next((art_iterator_t *)0x1105d9);
        art_iterator_next((art_iterator_t *)0x1105e3);
      }
      if ((((bVar1 & 1) == 0) || ((bVar2 & 1) != 0)) && (-1 < iVar4)) {
        if ((((bVar1 & 1) == 0) && ((bVar2 & 1) != 0)) || (0 < iVar4)) {
          in_stack_fffffffffffffeb0 = copy_leaf_container(in_stack_fffffffffffffeb0);
          art_iterator_insert((art_t *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0)
                              ,in_stack_fffffffffffffeb8,
                              (art_key_chunk_t *)in_stack_fffffffffffffeb0,
                              (art_val_t *)CONCAT17(type,in_stack_fffffffffffffea8));
          art_iterator_next((art_iterator_t *)0x110656);
        }
      }
      else {
        art_iterator_next((art_iterator_t *)0x110607);
      }
    }
  }
  return;
}

Assistant:

void roaring64_bitmap_or_inplace(roaring64_bitmap_t *r1,
                                 const roaring64_bitmap_t *r2) {
    if (r1 == r2) {
        return;
    }
    art_iterator_t it1 = art_init_iterator(&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator(&r2->art, /*first=*/true);

    while (it1.value != NULL || it2.value != NULL) {
        bool it1_present = it1.value != NULL;
        bool it2_present = it2.value != NULL;

        // Cases:
        // 1. it1_present  && !it2_present -> it1++
        // 2. !it1_present && it2_present  -> add it2, it2++
        // 3. it1_present  && it2_present
        //    a. it1 <  it2 -> it1++
        //    b. it1 == it2 -> it1 | it2, it1++, it2++
        //    c. it1 >  it2 -> add it2, it2++
        int compare_result = 0;
        if (it1_present && it2_present) {
            compare_result = compare_high48(it1.key, it2.key);
            if (compare_result == 0) {
                // Case 3b: iterators at the same high key position.
                leaf_t *leaf1 = (leaf_t *)it1.value;
                leaf_t *leaf2 = (leaf_t *)it2.value;
                uint8_t typecode2;
                container_t *container2;
                if (leaf1->typecode == SHARED_CONTAINER_TYPE) {
                    container2 = container_or(leaf1->container, leaf1->typecode,
                                              leaf2->container, leaf2->typecode,
                                              &typecode2);
                } else {
                    container2 = container_ior(
                        leaf1->container, leaf1->typecode, leaf2->container,
                        leaf2->typecode, &typecode2);
                }
                if (container2 != leaf1->container) {
                    container_free(leaf1->container, leaf1->typecode);
                    leaf1->container = container2;
                    leaf1->typecode = typecode2;
                }
                art_iterator_next(&it1);
                art_iterator_next(&it2);
            }
        }
        if ((it1_present && !it2_present) || compare_result < 0) {
            // Cases 1 and 3a: it1 is the only iterator or is before it2.
            art_iterator_next(&it1);
        } else if ((!it1_present && it2_present) || compare_result > 0) {
            // Cases 2 and 3c: it2 is the only iterator or is before it1.
            leaf_t *result_leaf = copy_leaf_container((leaf_t *)it2.value);
            art_iterator_insert(&r1->art, &it1, it2.key,
                                (art_val_t *)result_leaf);
            art_iterator_next(&it2);
        }
    }
}